

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SpecparamDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SpecparamDeclarationSyntax,slang::syntax::SpecparamDeclarationSyntax_const&>
          (BumpAllocator *this,SpecparamDeclarationSyntax *args)

{
  SpecparamDeclarationSyntax *this_00;
  
  this_00 = (SpecparamDeclarationSyntax *)allocate(this,0xb0,8);
  syntax::SpecparamDeclarationSyntax::SpecparamDeclarationSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }